

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O3

void Vec_StrPrintNumStar(Vec_Str_t *p,int Num,int nDigits)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  size_t sVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  int iVar9;
  char Digits [16];
  char local_38 [16];
  
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  if (Num == 0) {
    if (0 < nDigits) {
      do {
        uVar2 = p->nSize;
        if (uVar2 == p->nCap) {
          if ((int)uVar2 < 0x10) {
            if (p->pArray == (char *)0x0) {
              pcVar6 = (char *)malloc(0x10);
            }
            else {
              pcVar6 = (char *)realloc(p->pArray,0x10);
            }
            p->pArray = pcVar6;
            p->nCap = 0x10;
          }
          else {
            sVar4 = (ulong)uVar2 * 2;
            if (p->pArray == (char *)0x0) {
              pcVar6 = (char *)malloc(sVar4);
            }
            else {
              pcVar6 = (char *)realloc(p->pArray,sVar4);
            }
            p->pArray = pcVar6;
            p->nCap = (int)sVar4;
          }
        }
        else {
          pcVar6 = p->pArray;
        }
        iVar5 = p->nSize;
        p->nSize = iVar5 + 1;
        pcVar6[iVar5] = '0';
        nDigits = nDigits + -1;
      } while (nDigits != 0);
    }
  }
  else {
    if (Num < 0) {
      uVar2 = p->nSize;
      if (uVar2 == p->nCap) {
        if ((int)uVar2 < 0x10) {
          if (p->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(p->pArray,0x10);
          }
          p->pArray = pcVar6;
          p->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (p->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(p->pArray,sVar4);
          }
          p->pArray = pcVar6;
          p->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = p->pArray;
      }
      iVar5 = p->nSize;
      p->nSize = iVar5 + 1;
      pcVar6[iVar5] = '-';
      Num = -Num;
      nDigits = nDigits + -1;
    }
    lVar7 = 0;
    do {
      local_38[lVar7] = (char)Num + (char)((uint)Num / 10) * -10;
      lVar7 = lVar7 + 1;
      bVar3 = 9 < (uint)Num;
      Num = (uint)Num / 10;
    } while (bVar3);
    iVar5 = (int)lVar7;
    if ((int)lVar7 < nDigits) {
      iVar5 = nDigits;
    }
    iVar9 = iVar5 + 1;
    pcVar6 = local_38 + (iVar5 - 1);
    do {
      cVar1 = *pcVar6;
      uVar2 = p->nSize;
      if (uVar2 == p->nCap) {
        if ((int)uVar2 < 0x10) {
          if (p->pArray == (char *)0x0) {
            pcVar8 = (char *)malloc(0x10);
          }
          else {
            pcVar8 = (char *)realloc(p->pArray,0x10);
          }
          p->pArray = pcVar8;
          p->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (p->pArray == (char *)0x0) {
            pcVar8 = (char *)malloc(sVar4);
          }
          else {
            pcVar8 = (char *)realloc(p->pArray,sVar4);
          }
          p->pArray = pcVar8;
          p->nCap = (int)sVar4;
        }
      }
      else {
        pcVar8 = p->pArray;
      }
      iVar5 = p->nSize;
      p->nSize = iVar5 + 1;
      pcVar8[iVar5] = cVar1 + '0';
      iVar9 = iVar9 + -1;
      pcVar6 = pcVar6 + -1;
    } while (1 < iVar9);
  }
  return;
}

Assistant:

static inline void Vec_StrPrintNumStar( Vec_Str_t * p, int Num, int nDigits )
{
    int i;
    char Digits[16] = {0};
    if ( Num == 0 )
    {
        for ( i = 0; i < nDigits; i++ )
            Vec_StrPush( p, '0' );
        return;
    }
    if ( Num < 0 )
    {
        Vec_StrPush( p, '-' );
        Num = -Num;
        nDigits--;
    }
    for ( i = 0; Num; Num /= 10,  i++ )
        Digits[i] = Num % 10;
    for ( i = Abc_MaxInt(i, nDigits)-1; i >= 0; i-- )
        Vec_StrPush( p, (char)('0' + Digits[i]) );
}